

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_break::statement_break(statement_break *this,context_t *c,token_base *ptr)

{
  token_base *in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffc8;
  context_t *in_stack_ffffffffffffffd8;
  statement_base *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDI,in_stack_ffffffffffffffc8);
  statement_base::statement_base(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x56d795);
  in_RDI->_vptr_token_base = (_func_int **)&PTR__statement_break_006caef0;
  return;
}

Assistant:

statement_break(context_t c, token_base *ptr) : statement_base(std::move(c), ptr) {}